

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall Fl_Tree_Item::prev_visible(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs)

{
  int iVar1;
  Fl_Tree_Item *local_38;
  Fl_Tree_Item *local_30;
  Fl_Tree_Item *p;
  Fl_Tree_Item *c;
  Fl_Tree_Prefs *prefs_local;
  Fl_Tree_Item *this_local;
  
  p = this;
  do {
    if ((p == (Fl_Tree_Item *)0x0) || (local_38 = prev(p), local_38 == (Fl_Tree_Item *)0x0)) {
      return (Fl_Tree_Item *)0x0;
    }
    iVar1 = is_root(local_38);
    if (iVar1 != 0) {
      iVar1 = Fl_Tree_Prefs::showroot(prefs);
      if ((iVar1 == 0) || (iVar1 = visible(local_38), iVar1 == 0)) {
        local_38 = (Fl_Tree_Item *)0x0;
      }
      return local_38;
    }
    iVar1 = visible(local_38);
    p = local_38;
  } while (iVar1 == 0);
  local_30 = parent(local_38);
  while ((local_30 != (Fl_Tree_Item *)0x0 && (iVar1 = is_root(local_30), iVar1 == 0))) {
    iVar1 = is_close(local_30);
    if (iVar1 != 0) {
      p = local_30;
    }
    local_30 = parent(local_30);
  }
  return p;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::prev_visible(Fl_Tree_Prefs &prefs) {
  Fl_Tree_Item *c = this;
  while ( c ) {
    c = c->prev();					// previous item
    if ( !c ) break;					// no more items? done
    if ( c->is_root() )					// root
      return((prefs.showroot()&&c->visible()) ? c : 0);	// return root if visible
    if ( !c->visible() ) continue;			// item not visible? skip
    // Check all parents to be sure none are closed.
    // If closed, move up to that level and repeat until sure none are closed.
    Fl_Tree_Item *p = c->parent();
    while (1) {
      if ( !p || p->is_root() ) return(c);		// hit top? then we're displayed, return c
      if ( p->is_close() ) c = p;			// found closed parent? make it current
      p = p->parent();					// continue up tree
    }
  }
  return(0);						// hit end: no more items
}